

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_preserve_env(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_138 [8];
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  int r;
  
  init_process_options("spawn_helper7",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,(uv_pipe_t *)&stdio[1].data,0);
  options.stdio = (uv_stdio_container_t *)local_138;
  local_138._0_4_ = UV_IGNORE;
  stdio[0].data.fd = 0x21;
  stdio[1]._0_8_ = &stdio[1].data;
  options.stdio_count = 2;
  iVar1 = putenv("ENV_TEST=testval");
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x31e,"r == 0");
    abort();
  }
  options.env = (char **)0x0;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x324,"r == 0");
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)&stdio[1].data,on_alloc,on_read);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x327,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x32a,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x32c,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x32d,"close_cb_called == 2");
    abort();
  }
  printf("output is: %s",output);
  iVar1 = strcmp("testval",output);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x330,"strcmp(\"testval\", output) == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c"
            ,0x332,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_preserve_env) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper7", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = putenv("ENV_TEST=testval");
  ASSERT(r == 0);

  /* Explicitly set options.env to NULL to test for env clobbering. */
  options.env = NULL;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2);

  printf("output is: %s", output);
  ASSERT(strcmp("testval", output) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}